

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

void wallet::AppendLastProcessedBlock(UniValue *entry,CWallet *wallet)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string key;
  string key_00;
  string key_01;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  size_type sVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pUVar6;
  pointer pUVar7;
  pointer pUVar8;
  long in_FS_OFFSET;
  UniValue lastprocessedblock;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  undefined8 in_stack_fffffffffffffdb0;
  _Alloc_hider _Var9;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  undefined8 uVar10;
  undefined8 in_stack_fffffffffffffdc8;
  pointer in_stack_fffffffffffffdd0;
  pointer in_stack_fffffffffffffdd8;
  pointer in_stack_fffffffffffffde0;
  pointer in_stack_fffffffffffffde8;
  pointer in_stack_fffffffffffffdf0;
  pointer in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  undefined1 *puVar11;
  undefined8 in_stack_fffffffffffffe08;
  long in_stack_fffffffffffffe10;
  pointer in_stack_fffffffffffffe18;
  UniValue local_1e0;
  long *local_188 [2];
  long local_178 [2];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  string local_148;
  UniValue local_128;
  long *local_d0 [2];
  long local_c0 [2];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [9];
  undefined4 local_97;
  undefined2 local_93;
  char local_91;
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = local_a0;
  paVar1 = &local_90.val.field_2;
  local_90.typ = VOBJ;
  local_90.val.field_2._M_local_buf[0] = '\0';
  local_90.val.field_2._M_allocated_capacity._1_7_ = (undefined7)local_a0._1_8_;
  local_90.val.field_2._M_local_buf[8] = SUB81(local_a0._1_8_,7);
  local_90.val.field_2._9_4_ = local_97;
  local_90.val.field_2._13_2_ = local_93;
  local_90.val.field_2._M_local_buf[0xf] = local_91;
  local_90.val._M_string_length = 0;
  local_a8 = 0;
  local_a0[0] = 0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0[0] = local_c0;
  local_90.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"hash","");
  if (wallet->m_last_block_processed_height < 0) {
    __assert_fail("m_last_block_processed_height >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x3d7,"uint256 wallet::CWallet::GetLastBlockHash() const");
  }
  local_168 = *(undefined8 *)(wallet->m_last_block_processed).super_base_blob<256U>.m_data._M_elems;
  uStack_160 = *(undefined8 *)
                ((wallet->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8);
  local_158 = *(undefined8 *)
               ((wallet->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_150 = *(undefined8 *)
                ((wallet->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18);
  base_blob<256u>::GetHex_abi_cxx11_(&local_148,&local_168);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_128,&local_148);
  key._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffdac;
  key._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffda8;
  key._M_string_length = in_stack_fffffffffffffdb0;
  key.field_2._M_allocated_capacity = in_stack_fffffffffffffdb8;
  key.field_2._8_8_ = in_stack_fffffffffffffdc0;
  val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdd0;
  val._0_8_ = in_stack_fffffffffffffdc8;
  val.val._M_string_length = (size_type)in_stack_fffffffffffffdd8;
  val.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffde0;
  val.val.field_2._8_8_ = in_stack_fffffffffffffde8;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffdf0;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffdf8;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe00;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffffe08;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffffe10;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffffe18;
  UniValue::pushKV(&local_90,key,val);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_128.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.val._M_dataplus._M_p != &local_128.val.field_2) {
    operator_delete(local_128.val._M_dataplus._M_p,local_128.val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_148._M_dataplus._M_p._4_4_,(int)local_148._M_dataplus._M_p) !=
      &local_148.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_148._M_dataplus._M_p._4_4_,(int)local_148._M_dataplus._M_p),
                    local_148.field_2._M_allocated_capacity + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"height","");
  local_148._M_dataplus._M_p._0_4_ = wallet->m_last_block_processed_height;
  if ((int)local_148._M_dataplus._M_p < 0) {
    __assert_fail("m_last_block_processed_height >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x3d1,"int wallet::CWallet::GetLastBlockHeight() const");
  }
  UniValue::UniValue<int,_int,_true>(&local_1e0,(int *)&local_148);
  key_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffdac;
  key_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffda8;
  key_00._M_string_length = in_stack_fffffffffffffdb0;
  key_00.field_2._M_allocated_capacity = in_stack_fffffffffffffdb8;
  key_00.field_2._8_8_ = in_stack_fffffffffffffdc0;
  val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdd0;
  val_00._0_8_ = in_stack_fffffffffffffdc8;
  val_00.val._M_string_length = (size_type)in_stack_fffffffffffffdd8;
  val_00.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffde0;
  val_00.val.field_2._8_8_ = in_stack_fffffffffffffde8;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffdf0;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffdf8;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe00;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe08;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe10;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe18;
  UniValue::pushKV(&local_90,key_00,val_00);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1e0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.val._M_dataplus._M_p != &local_1e0.val.field_2) {
    operator_delete(local_1e0.val._M_dataplus._M_p,local_1e0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0],local_178[0] + 1);
  }
  puVar11 = &stack0xfffffffffffffe10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe00,"lastprocessedblock","");
  pUVar8 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pUVar7 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pUVar6 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
  pbVar5 = local_90.keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar4 = local_90.keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = local_90.keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar2 = local_90.val._M_string_length;
  _Var9._M_p = local_90.val._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p == paVar1) {
    in_stack_fffffffffffffdc8 =
         CONCAT17(local_90.val.field_2._M_local_buf[0xf],
                  CONCAT25(local_90.val.field_2._13_2_,
                           CONCAT41(local_90.val.field_2._9_4_,local_90.val.field_2._M_local_buf[8])
                          ));
    _Var9._M_p = (pointer)&stack0xfffffffffffffdc0;
  }
  uVar10._1_7_ = local_90.val.field_2._M_allocated_capacity._1_7_;
  uVar10._0_1_ = local_90.val.field_2._M_local_buf[0];
  local_90.val._M_string_length = 0;
  local_90.val.field_2._M_local_buf[0] = '\0';
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffdac;
  key_01._M_dataplus._M_p._0_4_ = local_90.typ;
  key_01._M_string_length = (size_type)_Var9._M_p;
  key_01.field_2._M_allocated_capacity = sVar2;
  key_01.field_2._8_8_ = uVar10;
  val_01.val._M_dataplus._M_p = (pointer)pbVar3;
  val_01._0_8_ = in_stack_fffffffffffffdc8;
  val_01.val._M_string_length = (size_type)pbVar4;
  val_01.val.field_2._M_allocated_capacity = (size_type)pbVar5;
  val_01.val.field_2._8_8_ = pUVar6;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pUVar7;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pUVar8;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar11;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe08;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe10;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe18;
  local_90.val._M_dataplus._M_p = (pointer)paVar1;
  UniValue::pushKV(entry,key_01,val_01);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffde8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffdd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var9._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&stack0xfffffffffffffdc0) {
    operator_delete(_Var9._M_p,uVar10 + 1);
  }
  if (puVar11 != &stack0xfffffffffffffe10) {
    operator_delete(puVar11,in_stack_fffffffffffffe10 + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.val._M_dataplus._M_p,
                    CONCAT71(local_90.val.field_2._M_allocated_capacity._1_7_,
                             local_90.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AppendLastProcessedBlock(UniValue& entry, const CWallet& wallet)
{
    AssertLockHeld(wallet.cs_wallet);
    UniValue lastprocessedblock{UniValue::VOBJ};
    lastprocessedblock.pushKV("hash", wallet.GetLastBlockHash().GetHex());
    lastprocessedblock.pushKV("height", wallet.GetLastBlockHeight());
    entry.pushKV("lastprocessedblock", std::move(lastprocessedblock));
}